

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall QDir::exists(QDir *this,QString *name)

{
  bool bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QMessageLogger *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QString *in_stack_ffffffffffffffc8;
  QDir *in_stack_ffffffffffffffd0;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x281daa);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff80,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    QMessageLogger::warning(&local_28,"QDir::exists: Empty or null file name");
    bVar2 = 0;
  }
  else {
    filePath(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bVar2 = QFileInfo::exists((QString *)
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    QString::~QString((QString *)0x281e1a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::exists(const QString &name) const
{
    if (name.isEmpty()) {
        qWarning("QDir::exists: Empty or null file name");
        return false;
    }
    return QFileInfo::exists(filePath(name));
}